

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O2

Builder * embree::sse2::BVH4InstanceMeshBuilderMortonGeneral
                    (void *bvh,Instance *mesh,GTypeMask gtype,uint geomID,size_t mode)

{
  BVHNMeshBuilderMorton<4,_embree::Instance,_embree::InstancePrimitive> *this;
  
  this = (BVHNMeshBuilderMorton<4,_embree::Instance,_embree::InstancePrimitive> *)
         ::operator_new(0x78);
  BVHNMeshBuilderMorton<4,_embree::Instance,_embree::InstancePrimitive>::BVHNMeshBuilderMorton
            (this,(BVH *)bvh,mesh,(uint)gtype,(ulong)geomID,1,7);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4InstanceMeshBuilderMortonGeneral (void* bvh, Instance* mesh, Geometry::GTypeMask gtype, unsigned int geomID, size_t mode) { return new class BVHNMeshBuilderMorton<4,Instance,InstancePrimitive>((BVH4*)bvh,mesh,gtype,geomID,1,BVH4::maxLeafBlocks); }